

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_msg.c
# Opt level: O2

int ssl_hs_is_proper_fragment(mbedtls_ssl_context *ssl)

{
  uchar *puVar1;
  int iVar2;
  uint uVar3;
  
  uVar3 = 1;
  if (ssl->in_hslen <= ssl->in_msglen) {
    puVar1 = ssl->in_msg;
    iVar2 = bcmp(puVar1 + 6,"",3);
    if (iVar2 == 0) {
      iVar2 = bcmp(puVar1 + 9,puVar1 + 1,3);
      uVar3 = (uint)(iVar2 != 0);
    }
  }
  return uVar3;
}

Assistant:

MBEDTLS_CHECK_RETURN_CRITICAL
static int ssl_hs_is_proper_fragment(mbedtls_ssl_context *ssl)
{
    if (ssl->in_msglen < ssl->in_hslen ||
        memcmp(ssl->in_msg + 6, "\0\0\0",        3) != 0 ||
        memcmp(ssl->in_msg + 9, ssl->in_msg + 1, 3) != 0) {
        return 1;
    }
    return 0;
}